

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peigstubs.c
# Opt level: O0

void pnga_diag(Integer g_a,Integer g_s,Integer g_v,DoublePrecision *eval)

{
  Integer in_stack_00000178;
  char *in_stack_00000180;
  
  pnga_error(in_stack_00000180,in_stack_00000178);
  return;
}

Assistant:

void pnga_diag(Integer g_a, Integer g_s, Integer g_v, DoublePrecision *eval) {
#if ENABLE_PEIGS
#   if ENABLE_F77
    gai_diag_(&g_a, &g_s, &g_v, eval);
#   else
    pnga_error("ga_diag:peigs interfaced, need to configure --enable-f77",0L);
#   endif
#else
    pnga_error("ga_diag:peigs not interfaced",0L);
#endif
}